

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O3

bool __thiscall draco::MeshEdgebreakerEncoder::InitializeEncoder(MeshEdgebreakerEncoder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EncoderOptions *pEVar2;
  MeshEdgebreakerEncoderImplInterface *pMVar3;
  Mesh *pMVar4;
  pointer paVar5;
  pointer paVar6;
  EncoderBuffer *pEVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this_00;
  string local_50;
  
  pEVar2 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"standard_edgebreaker","");
  bVar8 = Options::GetBool(&pEVar2->feature_options_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pEVar2 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"predictive_edgebreaker","");
  bVar9 = Options::GetBool(&pEVar2->feature_options_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pMVar3 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl;
  (this->impl_)._M_t.
  super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
  .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl =
       (MeshEdgebreakerEncoderImplInterface *)0x0;
  if (pMVar3 != (MeshEdgebreakerEncoderImplInterface *)0x0) {
    (*pMVar3->_vptr_MeshEdgebreakerEncoderImplInterface[1])();
  }
  pEVar2 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  pMVar4 = (this->super_MeshEncoder).mesh_;
  paVar5 = (pMVar4->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar6 = (pMVar4->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"edgebreaker_method","");
  iVar10 = Options::GetInt((Options *)pEVar2,&local_50,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar10 == 2) {
LAB_00137d4a:
    pEVar7 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
    local_50._M_dataplus._M_p._0_1_ = 2;
    if (pEVar7->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar7,
                 (pEVar7->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_50,
                 (undefined1 *)((long)&local_50._M_dataplus._M_p + 1));
    }
    this_00 = (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
              operator_new(0x2c8);
    MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
    MeshEdgebreakerEncoderImpl(this_00);
LAB_00137dc1:
    pMVar3 = (this->impl_)._M_t.
             super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>.
             _M_head_impl;
    (this->impl_)._M_t.
    super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
    .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl =
         &this_00->super_MeshEdgebreakerEncoderImplInterface;
    if (pMVar3 == (MeshEdgebreakerEncoderImplInterface *)0x0) goto LAB_00137de6;
    (*pMVar3->_vptr_MeshEdgebreakerEncoderImplInterface[1])();
  }
  else if (iVar10 == 0) {
    if (bVar8) {
LAB_00137d89:
      pEVar7 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
      local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
      if (pEVar7->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar7,
                   (pEVar7->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_50,
                   (undefined1 *)((long)&local_50._M_dataplus._M_p + 1));
      }
      this_00 = (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
                operator_new(0x260);
      MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::MeshEdgebreakerEncoderImpl
                ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)this_00);
      goto LAB_00137dc1;
    }
  }
  else if (iVar10 == -1) {
    if ((bVar8) &&
       (((iVar10 = EncoderOptionsBase<int>::GetSpeed
                             ((this->super_MeshEncoder).super_PointCloudEncoder.options_),
         (uint)((int)((ulong)((long)paVar5 - (long)paVar6) >> 2) * -0x55555555) < 1000 ||
         (4 < iVar10)) || (!bVar9)))) goto LAB_00137d89;
    goto LAB_00137d4a;
  }
  this_00 = (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
            (this->impl_)._M_t.
            super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
            .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl
  ;
  if (this_00 == (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)0x0) {
    return false;
  }
LAB_00137de6:
  iVar10 = (*(this_00->super_MeshEdgebreakerEncoderImplInterface).
             _vptr_MeshEdgebreakerEncoderImplInterface[2])(this_00,this);
  return (bool)(char)iVar10;
}

Assistant:

bool MeshEdgebreakerEncoder::InitializeEncoder() {
  const bool is_standard_edgebreaker_available =
      options()->IsFeatureSupported(features::kEdgebreaker);
  const bool is_predictive_edgebreaker_available =
      options()->IsFeatureSupported(features::kPredictiveEdgebreaker);

  impl_ = nullptr;
  // For tiny meshes it's usually better to use the basic edgebreaker as the
  // overhead of the predictive one may turn out to be too big.
  const bool is_tiny_mesh = mesh()->num_faces() < 1000;

  int selected_edgebreaker_method =
      options()->GetGlobalInt("edgebreaker_method", -1);
  if (selected_edgebreaker_method == -1) {
    if (is_standard_edgebreaker_available &&
        (options()->GetSpeed() >= 5 || !is_predictive_edgebreaker_available ||
         is_tiny_mesh)) {
      selected_edgebreaker_method = MESH_EDGEBREAKER_STANDARD_ENCODING;
    } else {
      selected_edgebreaker_method = MESH_EDGEBREAKER_VALENCE_ENCODING;
    }
  }

  if (selected_edgebreaker_method == MESH_EDGEBREAKER_STANDARD_ENCODING) {
    if (is_standard_edgebreaker_available) {
      buffer()->Encode(
          static_cast<uint8_t>(MESH_EDGEBREAKER_STANDARD_ENCODING));
      impl_ = std::unique_ptr<MeshEdgebreakerEncoderImplInterface>(
          new MeshEdgebreakerEncoderImpl<MeshEdgebreakerTraversalEncoder>());
    }
  } else if (selected_edgebreaker_method == MESH_EDGEBREAKER_VALENCE_ENCODING) {
    buffer()->Encode(static_cast<uint8_t>(MESH_EDGEBREAKER_VALENCE_ENCODING));
    impl_ = std::unique_ptr<MeshEdgebreakerEncoderImplInterface>(
        new MeshEdgebreakerEncoderImpl<
            MeshEdgebreakerTraversalValenceEncoder>());
  }
  if (!impl_) {
    return false;
  }
  if (!impl_->Init(this)) {
    return false;
  }
  return true;
}